

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-homedir.c
# Opt level: O0

int run_test_homedir(void)

{
  int iVar1;
  size_t sVar2;
  size_t sStack_410;
  int r;
  size_t len;
  char homedir [1024];
  
  sStack_410 = 0x400;
  len._0_1_ = '\0';
  sVar2 = strlen((char *)&len);
  if (sVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x25,"strlen(homedir) == 0");
    abort();
  }
  iVar1 = uv_os_homedir(&len,&stack0xfffffffffffffbf0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x27,"r == 0");
    abort();
  }
  sVar2 = strlen((char *)&len);
  if (sVar2 != sStack_410) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x28,"strlen(homedir) == len");
    abort();
  }
  if (sStack_410 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x29,"len > 0");
    abort();
  }
  if (homedir[sStack_410 - 8] != '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x2a,"homedir[len] == \'\\0\'");
    abort();
  }
  if (sStack_410 == 1) {
    if ((char)len != '/') {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
              ,0x33,"homedir[0] == \'/\'");
      abort();
    }
  }
  else if (*(char *)((long)&r + sStack_410 + 3) == '/') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x35,"homedir[len - 1] != \'/\'");
    abort();
  }
  sStack_410 = 1;
  iVar1 = uv_os_homedir(&len,&stack0xfffffffffffffbf0);
  if (iVar1 != -0x69) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x3b,"r == UV_ENOBUFS");
    abort();
  }
  if (sStack_410 < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x3c,"len > SMALLPATH");
    abort();
  }
  iVar1 = uv_os_homedir(0,&stack0xfffffffffffffbf0);
  if (iVar1 == -0x16) {
    iVar1 = uv_os_homedir(&len,0);
    if (iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
              ,0x42,"r == UV_EINVAL");
      abort();
    }
    sStack_410 = 0;
    iVar1 = uv_os_homedir(&len,&stack0xfffffffffffffbf0);
    if (iVar1 == -0x16) {
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
            ,0x45,"r == UV_EINVAL");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
          ,0x40,"r == UV_EINVAL");
  abort();
}

Assistant:

TEST_IMPL(homedir) {
  char homedir[PATHMAX];
  size_t len;
  int r;

  /* Test the normal case */
  len = sizeof homedir;
  homedir[0] = '\0';
  ASSERT(strlen(homedir) == 0);
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == 0);
  ASSERT(strlen(homedir) == len);
  ASSERT(len > 0);
  ASSERT(homedir[len] == '\0');

#ifdef _WIN32
  if (len == 3 && homedir[1] == ':')
    ASSERT(homedir[2] == '\\');
  else
    ASSERT(homedir[len - 1] != '\\');
#else
  if (len == 1)
    ASSERT(homedir[0] == '/');
  else
    ASSERT(homedir[len - 1] != '/');
#endif

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(len > SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_homedir(NULL, &len);
  ASSERT(r == UV_EINVAL);
  r = uv_os_homedir(homedir, NULL);
  ASSERT(r == UV_EINVAL);
  len = 0;
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == UV_EINVAL);

  return 0;
}